

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O2

int q_dgram_read(BIO *bio,char *dst,int bytesToRead)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  P _a;
  QLoggingCategory *pQVar4;
  void *pvVar5;
  size_t __n;
  undefined8 *__src;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dst == (char *)0x0 || bio == (BIO *)0x0) || bytesToRead < 1) {
    pQVar4 = lcTlsBackend();
    __n = 0;
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar4->name;
      local_48.d._0_4_ = 2;
      local_48.d._4_4_ = 0;
      local_48.ptr._0_4_ = 0;
      local_48.ptr._4_4_ = 0;
      local_48.size._0_4_ = 0;
      local_48.size._4_4_ = 0;
      __n = 0;
      QMessageLogger::warning((char *)&local_48,"invalid input parameter(s)");
    }
  }
  else {
    q_BIO_clear_flags(bio,0xf);
    pvVar5 = q_BIO_get_ex_data(bio,0);
    uVar1 = *(ulong *)((long)pvVar5 + 0x40);
    if (uVar1 == 0) {
      q_BIO_set_flags(bio,9);
      __n = 0xffffffffffffffff;
    }
    else {
      __n = (ulong)(uint)bytesToRead;
      if (uVar1 < (uint)bytesToRead) {
        __n = uVar1;
      }
      __src = *(undefined8 **)((long)pvVar5 + 0x38);
      if (__src == (undefined8 *)0x0) {
        __src = &QByteArray::_empty;
      }
      memcpy(dst,__src,__n);
      if (*(long *)((long)pvVar5 + 0x70) == 0) {
        QByteArray::mid((longlong)&local_48,(long)pvVar5 + 0x30);
        uVar2 = *(undefined8 *)((long)pvVar5 + 0x30);
        uVar3 = *(undefined8 *)((long)pvVar5 + 0x38);
        *(ulong *)((long)pvVar5 + 0x30) = CONCAT44(local_48.d._4_4_,local_48.d._0_4_);
        *(ulong *)((long)pvVar5 + 0x38) = CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
        local_48.d._0_4_ = (undefined4)uVar2;
        local_48.d._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        local_48.ptr._0_4_ = (undefined4)uVar3;
        local_48.ptr._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
        uVar2 = *(undefined8 *)((long)pvVar5 + 0x40);
        *(ulong *)((long)pvVar5 + 0x40) = CONCAT44(local_48.size._4_4_,(undefined4)local_48.size);
        local_48.size._0_4_ = (undefined4)uVar2;
        local_48.size._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)__n;
  }
  __stack_chk_fail();
}

Assistant:

int q_dgram_read(BIO *bio, char *dst, int bytesToRead)
{
    if (!bio || !dst || bytesToRead <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    // It's us who set data, if OpenSSL does too, the logic here is wrong
    // then and we have to use BIO_set_app_data then!
    Q_ASSERT(dtls);
    int bytesRead = 0;
    if (dtls->dgram.size()) {
        bytesRead = qMin(dtls->dgram.size(), bytesToRead);
        std::memcpy(dst, dtls->dgram.constData(), bytesRead);

        if (!dtls->peeking)
            dtls->dgram = dtls->dgram.mid(bytesRead);
    } else {
        bytesRead = -1;
    }

    if (bytesRead <= 0)
        q_BIO_set_retry_read(bio);

    return bytesRead;
}